

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanics.c
# Opt level: O3

void mc_abi_log(mc_abi *m)

{
  long lVar1;
  
  if (m != (mc_abi *)0x0) {
    puts("ArticulatedBodyInertiaCoord(");
    puts("  I=                     H=                     M=");
    lVar1 = -0x30;
    while( true ) {
      printf("  [%5.2f, %5.2f, %5.2f]",
             *(undefined8 *)((long)&(m->second_moment_of_mass).field_0 + lVar1 + 0x30),
             *(undefined8 *)((long)&(m->second_moment_of_mass).field_0 + lVar1 + 0x38),
             *(undefined8 *)((long)&(m->second_moment_of_mass).field_0 + lVar1 + 0x40));
      printf("  [%5.2f, %5.2f, %5.2f]",
             *(undefined8 *)((long)&(m->first_moment_of_mass).field_0 + lVar1 + 0x30),
             *(undefined8 *)((long)&(m->first_moment_of_mass).field_0 + lVar1 + 0x38),
             *(undefined8 *)((long)&(m->first_moment_of_mass).field_0 + lVar1 + 0x40));
      printf("  [%5.2f, %5.2f, %5.2f]",
             *(undefined8 *)((long)&(m->zeroth_moment_of_mass).field_0 + lVar1 + 0x30),
             *(undefined8 *)((long)&(m->zeroth_moment_of_mass).field_0 + lVar1 + 0x38),
             *(undefined8 *)((long)&(m->zeroth_moment_of_mass).field_0 + lVar1 + 0x40));
      if (lVar1 == 0) break;
      puts(",");
      lVar1 = lVar1 + 0x18;
    }
    puts(")");
    return;
  }
  __assert_fail("m",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/mechanics.c"
                ,0x24f,"void mc_abi_log(const struct mc_abi *)");
}

Assistant:

void mc_abi_log(
        const struct mc_abi *m)
{
    assert(m);

    printf("ArticulatedBodyInertiaCoord(\n");
    printf("  I=                     H=                     M=\n");
    for (int i = 0; i < 3; i++) {
        printf("  [%5.2f, %5.2f, %5.2f]",
                m->second_moment_of_mass.row[i].x,
                m->second_moment_of_mass.row[i].y,
                m->second_moment_of_mass.row[i].z);
        printf("  [%5.2f, %5.2f, %5.2f]",
                m->first_moment_of_mass.row[i].x,
                m->first_moment_of_mass.row[i].y,
                m->first_moment_of_mass.row[i].z);
        printf("  [%5.2f, %5.2f, %5.2f]",
                m->zeroth_moment_of_mass.row[i].x,
                m->zeroth_moment_of_mass.row[i].y,
                m->zeroth_moment_of_mass.row[i].z);
        if (i != 2) printf(",\n");
    }
    printf(")\n");
}